

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForNonEnum<std::__exception_ptr::exception_ptr,_std::string> *
lest::make_enum_string<std::__exception_ptr::exception_ptr>
          (ForNonEnum<std::__exception_ptr::exception_ptr,_std::string> *__return_storage_ptr__,
          exception_ptr *item)

{
  allocator<char> local_99;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"[type: ",&local_99);
  std::operator+(&local_78,&local_38,"NSt15__exception_ptr13exception_ptrE");
  std::operator+(&local_58,&local_78,"]: ");
  make_memory_string<std::__exception_ptr::exception_ptr>(&local_98,item);
  std::operator+(__return_storage_ptr__,&local_58,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

auto make_enum_string( T const & item ) -> ForNonEnum<T, std::string>
{
#if lest__cpp_rtti
    return text("[type: ") + typeid(T).name() + "]: " + make_memory_string( item );
#else
    return text("[type: (no RTTI)]: ") + make_memory_string( item );
#endif
}